

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O1

void __thiscall
Centaurus::NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>::print_subgraph
          (NFABase<Centaurus::NFABaseState<unsigned_char,_int>_> *this,wostream *os,int index,
          wstring *prefix)

{
  long *plVar1;
  wostream *pwVar2;
  ulong uVar3;
  pointer pNVar4;
  ulong uVar5;
  
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"subgraph cluster_",0x11);
  pwVar2 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     (os,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar2,L" {",2);
  plVar1 = *(long **)(pwVar2 + *(long *)(*(long *)pwVar2 + -0x18) + 0xf0);
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x50))(plVar1,10);
    std::wostream::put((wchar_t)pwVar2);
    std::wostream::flush();
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"label=\"[",8);
    pwVar2 = (wostream *)std::wostream::operator<<((wostream *)os,index);
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar2,L"]\"",2);
    plVar1 = *(long **)(pwVar2 + *(long *)(*(long *)pwVar2 + -0x18) + 0xf0);
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 0x50))(plVar1,10);
      std::wostream::put((wchar_t)pwVar2);
      std::wostream::flush();
      if ((this->m_states).
          super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->m_states).
          super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar5 = 0;
        do {
          pwVar2 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                             (os,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
          std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar2,L"_S",2);
          pwVar2 = std::wostream::_M_insert<unsigned_long>((ulong)pwVar2);
          std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar2,L" [ label=\"",10);
          (*this->_vptr_NFABase[2])(this,os,uVar5);
          std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"\", shape=circle ];",0x12);
          plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
          if (plVar1 == (long *)0x0) goto LAB_0012a286;
          (**(code **)(*plVar1 + 0x50))(plVar1,10);
          std::wostream::put((wchar_t)os);
          std::wostream::flush();
          uVar5 = (ulong)((int)uVar5 + 1);
          uVar3 = ((long)(this->m_states).
                         super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->m_states).
                         super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
        } while (uVar5 <= uVar3 && uVar3 - uVar5 != 0);
      }
      pNVar4 = (this->m_states).
               super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->m_states).
          super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != pNVar4) {
        uVar5 = 0;
        do {
          NFABaseState<unsigned_char,_int>::print_subgraph(pNVar4 + uVar5,os,(int)uVar5,prefix);
          uVar5 = (ulong)((int)uVar5 + 1);
          pNVar4 = (this->m_states).
                   super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar3 = ((long)(this->m_states).
                         super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar4 >> 3) *
                  -0x3333333333333333;
        } while (uVar5 <= uVar3 && uVar3 - uVar5 != 0);
      }
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"}",1);
      plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 0x50))(plVar1,10);
        std::wostream::put((wchar_t)os);
        std::wostream::flush();
        return;
      }
    }
  }
LAB_0012a286:
  std::__throw_bad_cast();
}

Assistant:

void print_subgraph(std::wostream& os, int index, const std::wstring& prefix) const
	{
		os << L"subgraph cluster_" << prefix << L" {" << std::endl;
		os << L"label=\"[" << index << L"]\"" << std::endl;
		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			os << prefix << L"_S" << i << L" [ label=\"";
			print_state(os, i);
			os << L"\", shape=circle ];" << std::endl;
		}
		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			m_states[i].print_subgraph(os, i, prefix);
		}
		os << L"}" << std::endl;
	}